

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::immediate_rep_sep
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_b [3];
  
  local_b[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_b);
    local_b[1] = 3;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_b + 1);
      local_b[2] = 0x2e;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_b + 2);
        return;
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void immediate_rep_sep(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);				// IDL.
		target(CycleFetchPreviousPCThrowaway);		// "Add 1 cycle for REP and SEP"
		target(OperationPerform);
	}